

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O1

void __thiscall PF_HashTable::PF_HashTable(PF_HashTable *this,int _numBuckets)

{
  PF_HashEntry **ppPVar1;
  ulong uVar2;
  
  this->numBuckets = _numBuckets;
  uVar2 = 0xffffffffffffffff;
  if (-1 < _numBuckets) {
    uVar2 = (long)_numBuckets * 8;
  }
  ppPVar1 = (PF_HashEntry **)operator_new__(uVar2);
  this->hashTable = ppPVar1;
  if (0 < _numBuckets) {
    uVar2 = 0;
    do {
      this->hashTable[uVar2] = (PF_HashEntry *)0x0;
      uVar2 = uVar2 + 1;
    } while ((uint)_numBuckets != uVar2);
  }
  return;
}

Assistant:

PF_HashTable::PF_HashTable(int _numBuckets)
{
  // Initialize numBuckets local variable from parameter
  this->numBuckets = _numBuckets;

  // Allocate memory for hash table
  hashTable = new PF_HashEntry* [numBuckets];

  // Initialize all buckets to empty
  for (int i = 0; i < numBuckets; i++)
    hashTable[i] = NULL;
}